

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Profile.cpp
# Opt level: O0

void __thiscall
Profile::applyProfiling
          (Profile *this,vector<void_*,_std::allocator<void_*>_> *btVec,string *label,
          ShadowValue *sv)

{
  bool bVar1;
  uintptr_t uVar2;
  ostream *poVar3;
  void *pvVar4;
  mapped_type *this_00;
  long in_RDI;
  vector<void_*,_std::allocator<void_*>_> *unaff_retaddr;
  Profile *in_stack_00000008;
  iterator statHashKeyIte;
  string staticHashKey;
  statHashKey_t shk;
  iterator dynHashKeyIte;
  shared_ptr<DynFuncCall> dfc;
  uintptr_t dynHashKey;
  unordered_map<unsigned_long,_std::shared_ptr<DynFuncCall>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<DynFuncCall>_>_>_>
  *in_stack_fffffffffffffe28;
  unordered_map<unsigned_long,_std::shared_ptr<DynFuncCall>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<DynFuncCall>_>_>_>
  *in_stack_fffffffffffffe30;
  vector<void_*,_std::allocator<void_*>_> *in_stack_fffffffffffffe40;
  char *in_stack_fffffffffffffe48;
  unsigned_long *in_stack_fffffffffffffe50;
  vector<void_*,_std::allocator<void_*>_> *in_stack_fffffffffffffe58;
  key_type *in_stack_fffffffffffffe68;
  Profile *in_stack_fffffffffffffe70;
  vector<void_*,_std::allocator<void_*>_> *in_stack_fffffffffffffe78;
  vector<void_*,_std::allocator<void_*>_> *in_stack_fffffffffffffe80;
  ShadowValue *in_stack_fffffffffffffe88;
  undefined7 in_stack_fffffffffffffe90;
  undefined1 in_stack_fffffffffffffe97;
  _Self local_108;
  _Self local_100 [3];
  _Self local_e8;
  _Self local_e0;
  string local_d8 [64];
  string local_98 [40];
  _Node_iterator_base<std::pair<const_unsigned_long,_std::shared_ptr<DynFuncCall>_>,_false>
  local_70 [3];
  _Node_iterator_base<std::pair<const_unsigned_long,_std::shared_ptr<DynFuncCall>_>,_false> local_58
  ;
  __shared_ptr local_50 [40];
  uintptr_t local_28;
  
  std::vector<void_*,_std::allocator<void_*>_>::vector
            (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
  uVar2 = __dynHashKey(in_stack_fffffffffffffe70,
                       (vector<void_*,_std::allocator<void_*>_> *)in_stack_fffffffffffffe68);
  std::vector<void_*,_std::allocator<void_*>_>::~vector(in_stack_fffffffffffffe40);
  local_28 = uVar2;
  std::shared_ptr<DynFuncCall>::shared_ptr
            ((shared_ptr<DynFuncCall> *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  local_58._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_long,_std::shared_ptr<DynFuncCall>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<DynFuncCall>_>_>_>
       ::find(in_stack_fffffffffffffe28,(key_type *)0x1dc512);
  local_70[0]._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_long,_std::shared_ptr<DynFuncCall>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<DynFuncCall>_>_>_>
       ::end(in_stack_fffffffffffffe28);
  bVar1 = std::__detail::operator==(&local_58,local_70);
  if (bVar1) {
    std::vector<void_*,_std::allocator<void_*>_>::vector
              (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
    __staticHashKey(in_stack_00000008,unaff_retaddr);
    std::vector<void_*,_std::allocator<void_*>_>::~vector(in_stack_fffffffffffffe40);
    std::__cxx11::string::string(local_d8,local_98);
    local_e0._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<DynFuncCall>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<DynFuncCall>_>_>_>
         ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<DynFuncCall>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<DynFuncCall>_>_>_>
                 *)in_stack_fffffffffffffe28,(key_type *)0x1dc5d6);
    local_e8._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<DynFuncCall>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<DynFuncCall>_>_>_>
         ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<DynFuncCall>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<DynFuncCall>_>_>_>
                *)in_stack_fffffffffffffe28);
    bVar1 = std::operator!=(&local_e0,&local_e8);
    if (bVar1) {
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<DynFuncCall>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<DynFuncCall>_>_>_>
      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<DynFuncCall>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<DynFuncCall>_>_>_>
                    *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
      std::shared_ptr<DynFuncCall>::operator=
                ((shared_ptr<DynFuncCall> *)in_stack_fffffffffffffe30,
                 (shared_ptr<DynFuncCall> *)in_stack_fffffffffffffe28);
      bVar1 = std::__shared_ptr::operator_cast_to_bool(local_50);
      if (!bVar1) {
        __assert_fail("dfc",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/hbrunie[P]PyFloT/internal/src/Profile.cpp"
                      ,0xee,"void Profile::applyProfiling(vector<void *> &, string, ShadowValue &)")
        ;
      }
      std::
      unordered_map<unsigned_long,_std::shared_ptr<DynFuncCall>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<DynFuncCall>_>_>_>
      ::operator[](in_stack_fffffffffffffe30,(key_type *)in_stack_fffffffffffffe28);
      std::shared_ptr<DynFuncCall>::operator=
                ((shared_ptr<DynFuncCall> *)in_stack_fffffffffffffe30,
                 (shared_ptr<DynFuncCall> *)in_stack_fffffffffffffe28);
    }
    else {
      std::make_shared<DynFuncCall,std::vector<void*,std::allocator<void*>>&,unsigned_long&>
                (in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
      std::shared_ptr<DynFuncCall>::operator=
                ((shared_ptr<DynFuncCall> *)in_stack_fffffffffffffe30,
                 (shared_ptr<DynFuncCall> *)in_stack_fffffffffffffe28);
      std::shared_ptr<DynFuncCall>::~shared_ptr((shared_ptr<DynFuncCall> *)0x1dc79a);
      std::
      unordered_map<unsigned_long,_std::shared_ptr<DynFuncCall>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<DynFuncCall>_>_>_>
      ::operator[](in_stack_fffffffffffffe30,(key_type *)in_stack_fffffffffffffe28);
      std::shared_ptr<DynFuncCall>::operator=
                ((shared_ptr<DynFuncCall> *)in_stack_fffffffffffffe30,
                 (shared_ptr<DynFuncCall> *)in_stack_fffffffffffffe28);
      std::__shared_ptr_access<DynFuncCall,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<DynFuncCall,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x1dc7e7);
      DynFuncCall::updateBtSymbols
                ((DynFuncCall *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90),
                 (statHashKey_t *)in_stack_fffffffffffffe88);
      local_100[0]._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<DynFuncCall>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<DynFuncCall>_>_>_>
           ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<DynFuncCall>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<DynFuncCall>_>_>_>
                  *)in_stack_fffffffffffffe28);
      local_108._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<DynFuncCall>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<DynFuncCall>_>_>_>
           ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<DynFuncCall>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<DynFuncCall>_>_>_>
                   *)in_stack_fffffffffffffe28,(key_type *)0x1dc829);
      bVar1 = std::operator==(local_100,&local_108);
      if (!bVar1) {
        __assert_fail("__backtraceStaticMap.end() == __backtraceStaticMap.find(staticHashKey)",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/hbrunie[P]PyFloT/internal/src/Profile.cpp"
                      ,0xf4,"void Profile::applyProfiling(vector<void *> &, string, ShadowValue &)")
        ;
      }
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<DynFuncCall>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<DynFuncCall>_>_>_>
      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<DynFuncCall>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<DynFuncCall>_>_>_>
                    *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
      std::shared_ptr<DynFuncCall>::operator=
                ((shared_ptr<DynFuncCall> *)in_stack_fffffffffffffe30,
                 (shared_ptr<DynFuncCall> *)in_stack_fffffffffffffe28);
      *(long *)(in_RDI + 0xa8) = *(long *)(in_RDI + 0xa8) + 1;
      if (((DebugFlag & 1U) != 0) &&
         (in_stack_fffffffffffffe97 = isCurrentDebugType(in_stack_fffffffffffffe48),
         (bool)in_stack_fffffffffffffe97)) {
        in_stack_fffffffffffffe88 =
             (ShadowValue *)std::operator<<((ostream *)&std::cerr,"applyProfiling");
        poVar3 = std::operator<<((ostream *)in_stack_fffffffffffffe88,":");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,0xf7);
        poVar3 = std::operator<<(poVar3," Total Call Stack ");
        pvVar4 = (void *)std::ostream::operator<<(poVar3,*(ulong *)(in_RDI + 0xa8));
        std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
      }
    }
    std::__cxx11::string::~string(local_d8);
    statHashKey_t::~statHashKey_t((statHashKey_t *)0x1dc9af);
  }
  else {
    if (((DebugFlag & 1U) != 0) && (bVar1 = isCurrentDebugType(in_stack_fffffffffffffe48), bVar1)) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"applyProfiling");
      poVar3 = std::operator<<(poVar3,":");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,0xfb);
      poVar3 = std::operator<<(poVar3," Elt already in Dynamic Hash Map ");
      pvVar4 = (void *)std::ostream::operator<<(poVar3,*(ulong *)(in_RDI + 0xa8));
      std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
    }
    this_00 = std::
              unordered_map<unsigned_long,_std::shared_ptr<DynFuncCall>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<DynFuncCall>_>_>_>
              ::operator[](in_stack_fffffffffffffe30,(key_type *)in_stack_fffffffffffffe28);
    std::shared_ptr<DynFuncCall>::operator=
              (this_00,(shared_ptr<DynFuncCall> *)in_stack_fffffffffffffe28);
  }
  std::__shared_ptr_access<DynFuncCall,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<DynFuncCall,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x1dcacf)
  ;
  DynFuncCall::applyProfiling
            ((DynFuncCall *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90),
             in_stack_fffffffffffffe88);
  *(long *)(in_RDI + 0x70) = *(long *)(in_RDI + 0x70) + 1;
  std::shared_ptr<DynFuncCall>::~shared_ptr((shared_ptr<DynFuncCall> *)0x1dcb02);
  return;
}

Assistant:

void Profile::applyProfiling(vector<void*> & btVec, string label, ShadowValue &sv){
#ifndef USE_LABEL
    //TODO: more efficient to change hashMap with key string?
    uintptr_t dynHashKey = __dynHashKey(btVec);
    UNUSED(label);
#else
    uintptr_t dynHashKey = hashLabel(label);
#endif
    shared_ptr<DynFuncCall> dfc(nullptr);
    auto dynHashKeyIte = __backtraceDynamicMap.find(dynHashKey);
    /* Can not find the element in Dynamic Hash Map */
    if(dynHashKeyIte == __backtraceDynamicMap.end()) {
        /* Update Static HashMap */
#ifndef USE_LABEL
        struct statHashKey_t shk = __staticHashKey(btVec);
        string staticHashKey = shk.hashKey;
#else
        string staticHashKey = label;
#endif
        auto statHashKeyIte = __backtraceStaticMap.find(staticHashKey);
        /* Element can still be in Static backtrace map
         * Indeed: 2 ASLR sensitive backtraces may correspond to
         * the same dladdr based backtrace(the missing index bug!).
         * */
        if(statHashKeyIte != __backtraceStaticMap.end()) {
            dfc = __backtraceStaticMap[staticHashKey];
            assert(dfc);
            __backtraceDynamicMap[dynHashKey] = dfc;
        }else{
            dfc = make_shared<DynFuncCall>(btVec, dynHashKey);
            __backtraceDynamicMap[dynHashKey] = dfc;
            dfc->updateBtSymbols(shk);
            assert(__backtraceStaticMap.end() == __backtraceStaticMap.find(staticHashKey));
            __backtraceStaticMap[staticHashKey] = dfc;
            __totalCallStacks += 1;
            DEBUG("total",cerr << __FUNCTION__ << ":" << __LINE__<< " Total Call Stack " << __totalCallStacks <<endl;);
        }
    }else{
        // The element is in Dynamic Hash Map
        DEBUG("total",cerr << __FUNCTION__ << ":" << __LINE__<< " Elt already in Dynamic Hash Map " << __totalCallStacks <<endl;);
        dfc = __backtraceDynamicMap[dynHashKey];
    }
    dfc->applyProfiling(sv);
    __totalDynCount++;
}